

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

void stl(double *x,int N,int f,char *s_window_type,int *s_window,int *s_degree,int *t_window,
        int *t_degree,int *l_window,int *l_degree,int *s_jump,int *t_jump,int *l_jump,int *robust,
        int *inner,int *outer,double *seasonal,double *trend,double *remainder)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  int local_dc;
  int local_d8;
  int local_d4;
  double local_d0;
  double local_c8;
  double local_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int robust_;
  int periodic_;
  int outer_;
  int inner_;
  int l_jump_;
  int t_jump_;
  int s_jump_;
  int l_degree_;
  int l_window_;
  int t_degree_;
  int t_window_;
  int s_degree_;
  int s_window_;
  int i;
  int *seas_cycle;
  double *work;
  double *rw;
  int *s_degree_local;
  int *s_window_local;
  char *s_window_type_local;
  int f_local;
  int N_local;
  double *x_local;
  
  rw = (double *)s_degree;
  s_degree_local = s_window;
  s_window_local = (int *)s_window_type;
  s_window_type_local._0_4_ = f;
  s_window_type_local._4_4_ = N;
  _f_local = x;
  if ((1 < f) && (SBORROW4(N,f * 2) == N + f * -2 < 0)) {
    bVar1 = false;
    iVar2 = strcmp(s_window_type,"period");
    if (iVar2 == 0) {
      bVar1 = true;
      t_window_ = s_window_type_local._4_4_ * 10 + 1;
      t_degree_ = 0;
    }
    else {
      if (s_degree_local == (int *)0x0) {
        printf("Error. Either set s_window_type to period or assign an integer value to s_window \n"
              );
        exit(-1);
      }
      t_window_ = *s_degree_local;
    }
    if (t_window == (int *)0x0) {
      dVar3 = ceil(((double)(int)s_window_type_local * 1.5) / (1.0 - 1.5 / (double)t_window_));
      l_window_ = nextOdd((int)dVar3);
    }
    if (rw == (double *)0x0) {
      local_ac = 0;
    }
    else {
      local_ac = *(int *)rw;
    }
    t_degree_ = local_ac;
    if (t_degree == (int *)0x0) {
      local_b0 = 1;
    }
    else {
      local_b0 = *t_degree;
    }
    l_degree_ = local_b0;
    if (l_window == (int *)0x0) {
      local_b4 = nextOdd((int)s_window_type_local);
    }
    else {
      local_b4 = *l_window;
    }
    s_jump_ = local_b4;
    if (l_degree == (int *)0x0) {
      local_b8 = l_degree_;
    }
    else {
      local_b8 = *l_degree;
    }
    t_jump_ = local_b8;
    if (s_jump == (int *)0x0) {
      local_c0 = ceil((double)t_window_ / 10.0);
    }
    else {
      local_c0 = (double)*s_jump;
    }
    l_jump_ = (int)local_c0;
    if (t_jump == (int *)0x0) {
      local_c8 = ceil((double)l_window_ / 10.0);
    }
    else {
      local_c8 = (double)*t_jump;
    }
    inner_ = (int)local_c8;
    if (l_jump == (int *)0x0) {
      local_d0 = ceil((double)s_jump_ / 10.0);
    }
    else {
      local_d0 = (double)*l_jump;
    }
    outer_ = (int)local_d0;
    if (robust == (int *)0x0) {
      local_d4 = 0;
    }
    else {
      local_d4 = *robust;
    }
    if (inner == (int *)0x0) {
      local_d8 = 2;
      if (local_d4 != 0) {
        local_d8 = 1;
      }
    }
    else {
      local_d8 = *inner;
    }
    periodic_ = local_d8;
    if (inner == (int *)0x0) {
      local_dc = 0;
      if (local_d4 != 0) {
        local_dc = 0xf;
      }
    }
    else {
      local_dc = *outer;
    }
    robust_ = local_dc;
    t_degree_ = degCheck(t_degree_);
    l_degree_ = degCheck(l_degree_);
    t_jump_ = degCheck(t_jump_);
    work = (double *)calloc((long)s_window_type_local._4_4_,8);
    seas_cycle = (int *)calloc((long)((s_window_type_local._4_4_ + (int)s_window_type_local * 2) * 5
                                     ),8);
    _s_window_ = (int *)calloc((long)s_window_type_local._4_4_,4);
    stl_(_f_local,(int *)((long)&s_window_type_local + 4),(int *)&s_window_type_local,&t_window_,
         &l_window_,&s_jump_,&t_degree_,&l_degree_,&t_jump_,&l_jump_,&inner_,&outer_,&periodic_,
         &robust_,work,seasonal,trend,(double *)seas_cycle);
    if (bVar1) {
      cycle(s_window_type_local._4_4_,(int)s_window_type_local,_s_window_);
      applySeasonalMean(seasonal,s_window_type_local._4_4_,_s_window_,(int)s_window_type_local);
    }
    for (s_degree_ = 0; s_degree_ < s_window_type_local._4_4_; s_degree_ = s_degree_ + 1) {
      remainder[s_degree_] = (_f_local[s_degree_] - seasonal[s_degree_]) - trend[s_degree_];
    }
    free(work);
    free(seas_cycle);
    free(_s_window_);
    return;
  }
  printf("Series is not periodic or has less than two periods. \n");
  exit(-1);
}

Assistant:

void stl(double *x,int N,int f, const char *s_window_type,int *s_window, int *s_degree, int *t_window, int *t_degree,int *l_window,int *l_degree,
    int *s_jump, int *t_jump, int *l_jump, int *robust,int *inner, int *outer,double *seasonal,double *trend, double *remainder) {
    
    double *rw,*work;
    int *seas_cycle;
    int i;
    int s_window_,s_degree_,t_window_,t_degree_,l_window_,l_degree_,s_jump_,t_jump_,l_jump_,inner_,outer_,periodic_,robust_;

    if (f < 2 || N < 2*f) {
        printf("Series is not periodic or has less than two periods. \n");
        exit(-1);
    }

    //Default Values

    periodic_ = 0;

    if (!strcmp(s_window_type,"period")) {
        periodic_ = 1;
        s_window_ = 10 * N + 1;
        s_degree_ = 0;
    } else {
        if (s_window == NULL) {
            printf("Error. Either set s_window_type to period or assign an integer value to s_window \n");
            exit(-1);
        } else {
            s_window_ = *s_window;
        }
    }

    if (t_window == NULL) {
        t_window_ = nextOdd(ceil( 1.5 * f / (1.0 - 1.5 / (double) s_window_)));
    }

    s_degree_ = (s_degree == NULL) ? 0 : *s_degree;

    //if (t_window == NULL) *t_window = 0;
    t_degree_ = (t_degree == NULL) ? 1 : *t_degree;
    l_window_ = (l_window == NULL) ? nextOdd(f) : *l_window;
    l_degree_ = (l_degree == NULL) ? t_degree_ : *l_degree;
    s_jump_ = (s_jump == NULL) ? ceil((double)s_window_ / 10.0) : *s_jump;
    t_jump_ = (t_jump == NULL) ? ceil((double)t_window_ / 10.0) : *t_jump;
    l_jump_ = (l_jump == NULL) ? ceil((double)l_window_ / 10.0) : *l_jump;

    robust_ = (robust == NULL) ? 0 : *robust;
    inner_ = (inner == NULL) ? (robust_ ? 1 : 2) : *inner;
    outer_ = (inner == NULL) ? (robust_ ? 15 : 0) : *outer;

    
    s_degree_ = degCheck(s_degree_);
    t_degree_ = degCheck(t_degree_);
    l_degree_ = degCheck(l_degree_);

    

    // Initialize work vectors

    rw = (double*)calloc(N,sizeof(double));
    work = (double*)calloc((N+2*f)*5,sizeof(double));
    seas_cycle = (int*)calloc(N,sizeof(int));


    stl_(x,&N,&f,&s_window_,&t_window_,&l_window_,&s_degree_,&t_degree_,&l_degree_,&s_jump_,&t_jump_,&l_jump_,&inner_,&outer_,rw,seasonal,trend,work);
	

    if (periodic_) {
        cycle(N,f,seas_cycle);
        applySeasonalMean(seasonal,N,seas_cycle,f);
    }

    for (i = 0; i < N;++i) {
        remainder[i] = x[i] - seasonal[i] - trend[i];
    }

    free(rw);
    free(work);
    free(seas_cycle);
}